

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  uint uVar1;
  _GLFWwindow *window;
  int value_local;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      uVar1 = (uint)(value != 0);
      switch(attrib) {
      case 0x20003:
        *(uint *)(handle + 8) = uVar1;
        if (*(long *)(handle + 0x50) == 0) {
          (*_glfw.platform.setWindowResizable)((_GLFWwindow *)handle,uVar1);
        }
        break;
      default:
        _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)(uint)attrib);
        break;
      case 0x20005:
        *(uint *)(handle + 0xc) = uVar1;
        if (*(long *)(handle + 0x50) == 0) {
          (*_glfw.platform.setWindowDecorated)((_GLFWwindow *)handle,uVar1);
        }
        break;
      case 0x20006:
        *(uint *)(handle + 0x10) = uVar1;
        break;
      case 0x20007:
        *(uint *)(handle + 0x14) = uVar1;
        if (*(long *)(handle + 0x50) == 0) {
          (*_glfw.platform.setWindowFloating)((_GLFWwindow *)handle,uVar1);
        }
        break;
      case 0x2000c:
        *(uint *)(handle + 0x18) = uVar1;
        break;
      case 0x2000d:
        *(uint *)(handle + 0x1c) = uVar1;
        (*_glfw.platform.setWindowMousePassthrough)((_GLFWwindow *)handle,uVar1);
      }
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                ,0x3a3,"void glfwSetWindowAttrib(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    switch (attrib)
    {
        case GLFW_AUTO_ICONIFY:
            window->autoIconify = value;
            return;

        case GLFW_RESIZABLE:
            window->resizable = value;
            if (!window->monitor)
                _glfw.platform.setWindowResizable(window, value);
            return;

        case GLFW_DECORATED:
            window->decorated = value;
            if (!window->monitor)
                _glfw.platform.setWindowDecorated(window, value);
            return;

        case GLFW_FLOATING:
            window->floating = value;
            if (!window->monitor)
                _glfw.platform.setWindowFloating(window, value);
            return;

        case GLFW_FOCUS_ON_SHOW:
            window->focusOnShow = value;
            return;

        case GLFW_MOUSE_PASSTHROUGH:
            window->mousePassthrough = value;
            _glfw.platform.setWindowMousePassthrough(window, value);
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}